

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz_old.cpp
# Opt level: O3

void anon_unknown.dwarf_2b348b::scaleImage<(anonymous_namespace)::Scaler3x>
               (uint32_t *src,uint32_t *trg,int srcWidth,int srcHeight,ScalerCfg *cfg,int yFirst,
               int yLast)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  byte bVar7;
  int iVar8;
  ulong __n;
  uint32_t colAlpha_16;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint *puVar21;
  char cVar22;
  byte bVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  void *__s;
  uint32_t *puVar29;
  uint uVar30;
  ulong uVar31;
  uint32_t colAlpha;
  uint uVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  uint uVar37;
  uint32_t colAlpha_12;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  uint uVar42;
  ulong uVar43;
  uint uVar44;
  bool bVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  ulong local_98;
  uint32_t *local_90;
  
  uVar31 = 0;
  if (0 < yFirst) {
    uVar31 = (ulong)(uint)yFirst;
  }
  if (srcHeight < yLast) {
    yLast = srcHeight;
  }
  iVar25 = (int)uVar31;
  if (0 < srcWidth && iVar25 < yLast) {
    uVar13 = (ulong)(uint)(srcWidth * 9 * yLast);
    __n = (ulong)(uint)srcWidth;
    __s = (void *)((long)trg + (uVar13 * 4 - __n));
    memset(__s,0,__n);
    if (0 < yFirst) {
      iVar12 = 2;
      if (2 < (uint)yFirst) {
        iVar12 = yFirst;
      }
      uVar14 = (iVar12 + -2) * srcWidth;
      uVar9 = (iVar25 + -1) * srcWidth;
      uVar15 = iVar25 * srcWidth;
      iVar12 = iVar25 + 1;
      if (srcHeight + -1 < iVar25 + 1) {
        iVar12 = srcHeight + -1;
      }
      iVar10 = srcWidth + -1;
      lVar18 = uVar13 * 4 - __n;
      uVar13 = 0;
      do {
        iVar24 = (int)uVar13;
        iVar16 = 1;
        if (1 < iVar24) {
          iVar16 = iVar24;
        }
        uVar39 = uVar13 + 1;
        iVar11 = (int)uVar39;
        if (iVar10 < (int)uVar39) {
          iVar11 = iVar10;
        }
        iVar17 = iVar24 + 2;
        if (iVar10 < iVar24 + 2) {
          iVar17 = iVar10;
        }
        uVar3 = src[uVar14 + uVar13];
        lVar34 = (long)iVar11;
        uVar4 = src[(ulong)uVar14 + lVar34];
        uVar36 = src[(ulong)uVar9 + (ulong)(iVar16 - 1)];
        uVar37 = src[uVar9 + uVar13];
        uVar26 = src[(ulong)uVar9 + lVar34];
        uVar28 = src[(ulong)uVar9 + (long)iVar17];
        uVar5 = src[(ulong)uVar15 + (ulong)(iVar16 - 1)];
        uVar30 = src[uVar15 + uVar13];
        uVar38 = src[(ulong)uVar15 + lVar34];
        uVar33 = src[(ulong)uVar15 + (long)iVar17];
        uVar32 = src[(long)(iVar12 * srcWidth) + uVar13];
        uVar41 = src[iVar12 * srcWidth + lVar34];
        if (((uVar37 == uVar26) && (uVar30 == uVar38)) || ((uVar37 == uVar30 && (uVar26 == uVar38)))
           ) {
LAB_0044055d:
          lVar34 = 0;
        }
        else {
          dVar51 = cfg->luminanceWeight_;
          dVar49 = 0.0;
          dVar52 = 0.0;
          if (uVar5 != uVar37) {
            dVar52 = (double)(int)((uVar5 >> 0x10 & 0xff) - (uVar37 >> 0x10 & 0xff));
            dVar53 = (double)(int)((uVar5 & 0xff) - (uVar37 & 0xff));
            dVar54 = dVar53 * 0.0722 +
                     (double)(int)((uVar5 >> 8 & 0xff) - (uVar37 >> 8 & 0xff)) * 0.7152 +
                     dVar52 * 0.2126;
            dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
            dVar52 = (dVar52 - dVar54) * 0.63500127000254;
            dVar52 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar52 * dVar52 + dVar53 * dVar53);
          }
          if (uVar37 != uVar4) {
            dVar49 = (double)(int)((uVar37 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
            dVar53 = (double)(int)((uVar37 & 0xff) - (uVar4 & 0xff));
            dVar54 = dVar53 * 0.0722 +
                     (double)(int)((uVar37 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152 +
                     dVar49 * 0.2126;
            dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
            dVar49 = (dVar49 - dVar54) * 0.63500127000254;
            dVar49 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar49 * dVar49 + dVar53 * dVar53);
          }
          dVar53 = 0.0;
          dVar54 = 0.0;
          if (uVar32 != uVar38) {
            dVar54 = (double)(int)((uVar32 >> 0x10 & 0xff) - (uVar38 >> 0x10 & 0xff));
            dVar55 = (double)(int)((uVar32 & 0xff) - (uVar38 & 0xff));
            dVar56 = dVar55 * 0.0722 +
                     (double)(int)((uVar32 >> 8 & 0xff) - (uVar38 >> 8 & 0xff)) * 0.7152 +
                     dVar54 * 0.2126;
            dVar55 = (dVar55 - dVar56) * 0.5389092476826902;
            dVar54 = (dVar54 - dVar56) * 0.63500127000254;
            dVar54 = SQRT(dVar56 * dVar51 * dVar56 * dVar51 + dVar54 * dVar54 + dVar55 * dVar55);
          }
          if (uVar38 != uVar28) {
            dVar53 = (double)(int)((uVar38 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
            dVar55 = (double)(int)((uVar38 & 0xff) - (uVar28 & 0xff));
            dVar56 = dVar55 * 0.0722 +
                     (double)(int)((uVar38 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) * 0.7152 +
                     dVar53 * 0.2126;
            dVar55 = (dVar55 - dVar56) * 0.5389092476826902;
            dVar53 = (dVar53 - dVar56) * 0.63500127000254;
            dVar53 = SQRT(dVar56 * dVar51 * dVar56 * dVar51 + dVar53 * dVar53 + dVar55 * dVar55);
          }
          dVar56 = 0.0;
          dVar55 = 0.0;
          if (uVar30 != uVar26) {
            dVar55 = (double)(int)((uVar30 >> 0x10 & 0xff) - (uVar26 >> 0x10 & 0xff));
            dVar57 = (double)(int)((uVar30 & 0xff) - (uVar26 & 0xff));
            dVar58 = dVar57 * 0.0722 +
                     (double)(int)((uVar30 >> 8 & 0xff) - (uVar26 >> 8 & 0xff)) * 0.7152 +
                     dVar55 * 0.2126;
            dVar57 = (dVar57 - dVar58) * 0.5389092476826902;
            dVar55 = (dVar55 - dVar58) * 0.63500127000254;
            dVar55 = SQRT(dVar58 * dVar51 * dVar58 * dVar51 + dVar55 * dVar55 + dVar57 * dVar57) *
                     4.0;
          }
          if (uVar36 != uVar30) {
            dVar56 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar30 >> 0x10 & 0xff));
            dVar57 = (double)(int)((uVar36 & 0xff) - (uVar30 & 0xff));
            dVar58 = dVar57 * 0.0722 +
                     (double)(int)((uVar36 >> 8 & 0xff) - (uVar30 >> 8 & 0xff)) * 0.7152 +
                     dVar56 * 0.2126;
            dVar57 = (dVar57 - dVar58) * 0.5389092476826902;
            dVar56 = (dVar56 - dVar58) * 0.63500127000254;
            dVar56 = SQRT(dVar58 * dVar51 * dVar58 * dVar51 + dVar56 * dVar56 + dVar57 * dVar57);
          }
          dVar58 = 0.0;
          dVar57 = 0.0;
          if (uVar30 != uVar41) {
            dVar50 = (double)(int)((uVar30 >> 0x10 & 0xff) - (uVar41 >> 0x10 & 0xff));
            dVar46 = (double)(int)((uVar30 & 0xff) - (uVar41 & 0xff));
            dVar57 = dVar46 * 0.0722 +
                     (double)(int)((uVar30 >> 8 & 0xff) - (uVar41 >> 8 & 0xff)) * 0.7152 +
                     dVar50 * 0.2126;
            dVar46 = (dVar46 - dVar57) * 0.5389092476826902;
            dVar50 = (dVar50 - dVar57) * 0.63500127000254;
            dVar57 = SQRT(dVar57 * dVar51 * dVar57 * dVar51 + dVar50 * dVar50 + dVar46 * dVar46);
          }
          if (uVar3 != uVar26) {
            dVar58 = (double)(int)((uVar3 >> 0x10 & 0xff) - (uVar26 >> 0x10 & 0xff));
            dVar46 = (double)(int)((uVar3 & 0xff) - (uVar26 & 0xff));
            dVar50 = dVar46 * 0.0722 +
                     (double)(int)((uVar3 >> 8 & 0xff) - (uVar26 >> 8 & 0xff)) * 0.7152 +
                     dVar58 * 0.2126;
            dVar46 = (dVar46 - dVar50) * 0.5389092476826902;
            dVar58 = (dVar58 - dVar50) * 0.63500127000254;
            dVar58 = SQRT(dVar50 * dVar51 * dVar50 * dVar51 + dVar58 * dVar58 + dVar46 * dVar46);
          }
          dVar50 = 0.0;
          dVar46 = 0.0;
          if (uVar26 != uVar33) {
            dVar46 = (double)(int)((uVar26 >> 0x10 & 0xff) - (uVar33 >> 0x10 & 0xff));
            dVar48 = (double)(int)((uVar26 & 0xff) - (uVar33 & 0xff));
            dVar47 = dVar48 * 0.0722 +
                     (double)(int)((uVar26 >> 8 & 0xff) - (uVar33 >> 8 & 0xff)) * 0.7152 +
                     dVar46 * 0.2126;
            dVar48 = (dVar48 - dVar47) * 0.5389092476826902;
            dVar46 = (dVar46 - dVar47) * 0.63500127000254;
            dVar46 = SQRT(dVar47 * dVar51 * dVar47 * dVar51 + dVar46 * dVar46 + dVar48 * dVar48);
          }
          if (uVar37 != uVar38) {
            dVar48 = (double)(int)((uVar37 >> 0x10 & 0xff) - (uVar38 >> 0x10 & 0xff));
            dVar50 = (double)(int)((uVar37 & 0xff) - (uVar38 & 0xff));
            dVar47 = dVar50 * 0.0722 +
                     (double)(int)((uVar37 >> 8 & 0xff) - (uVar38 >> 8 & 0xff)) * 0.7152 +
                     dVar48 * 0.2126;
            dVar50 = (dVar50 - dVar47) * 0.5389092476826902;
            dVar48 = (dVar48 - dVar47) * 0.63500127000254;
            dVar50 = SQRT(dVar47 * dVar51 * dVar47 * dVar51 + dVar48 * dVar48 + dVar50 * dVar50) *
                     4.0;
          }
          dVar55 = dVar49 + dVar52 + dVar54 + dVar53 + dVar55;
          dVar50 = dVar57 + dVar56 + dVar58 + dVar46 + dVar50;
          if (dVar50 <= dVar55) {
            if (dVar55 <= dVar50) goto LAB_0044055d;
            lVar34 = (ulong)(dVar50 * cfg->dominantDirectionThreshold < dVar55) + 1;
            bVar45 = uVar30 == uVar38;
            uVar38 = uVar37;
            if (bVar45) {
              lVar34 = 0;
            }
          }
          else {
            lVar34 = 0x100000000;
            if (dVar55 * cfg->dominantDirectionThreshold < dVar50) {
              lVar34 = 0x200000000;
            }
            if (uVar26 == uVar38) {
              lVar34 = 0;
            }
          }
          if (uVar30 == uVar38) {
            lVar34 = 0;
          }
        }
        pbVar1 = (byte *)((long)trg + uVar13 + lVar18);
        *pbVar1 = *pbVar1 | (char)lVar34 * '\x04';
        if (uVar39 < __n) {
          pbVar1 = (byte *)((long)trg + uVar13 + lVar18 + 1);
          *pbVar1 = *pbVar1 | (byte)((ulong)lVar34 >> 0x20);
        }
        uVar13 = uVar39;
      } while (__n != uVar39);
    }
    iVar12 = srcHeight + -1;
    iVar10 = srcWidth + -1;
    uVar13 = (ulong)(uint)(srcWidth * 3);
    uVar9 = iVar25 * srcWidth * 9;
    do {
      iVar16 = (int)uVar31;
      iVar25 = 1;
      if (1 < iVar16) {
        iVar25 = iVar16;
      }
      local_90 = trg + (ulong)uVar9 + 2;
      iVar24 = (iVar25 + -1) * srcWidth;
      lVar18 = uVar31 * __n;
      uVar31 = uVar31 + 1;
      iVar25 = (int)uVar31;
      if (iVar12 < (int)uVar31) {
        iVar25 = iVar12;
      }
      iVar25 = iVar25 * srcWidth;
      iVar11 = iVar16 + 2;
      if (iVar12 < iVar16 + 2) {
        iVar11 = iVar12;
      }
      puVar21 = trg + (uint)(srcWidth * 9 * iVar16);
      local_98 = 0;
      uVar39 = 0;
      do {
        iVar17 = (int)uVar39;
        iVar16 = 1;
        if (1 < iVar17) {
          iVar16 = iVar17;
        }
        uVar43 = (ulong)(iVar16 - 1);
        uVar40 = uVar39 + 1;
        iVar16 = (int)uVar40;
        if (iVar10 < (int)uVar40) {
          iVar16 = iVar10;
        }
        iVar8 = iVar17 + 2;
        if (iVar10 < iVar17 + 2) {
          iVar8 = iVar10;
        }
        uVar14 = src[(long)iVar24 + uVar39];
        lVar34 = (long)iVar16;
        uVar15 = src[iVar24 + lVar34];
        uVar3 = src[lVar18 + uVar43];
        uVar4 = src[lVar18 + uVar39];
        uVar36 = src[lVar18 + lVar34];
        uVar37 = src[lVar18 + iVar8];
        uVar26 = src[(long)iVar25 + uVar43];
        uVar28 = src[(long)iVar25 + uVar39];
        uVar5 = src[iVar25 + lVar34];
        uVar30 = src[(long)iVar25 + (long)iVar8];
        uVar33 = src[(long)(iVar11 * srcWidth) + uVar39];
        uVar32 = src[iVar11 * srcWidth + lVar34];
        if (((uVar4 == uVar36) && (uVar28 == uVar5)) || ((uVar4 == uVar28 && (uVar36 == uVar5)))) {
          uVar35 = 0;
          uVar27 = 0;
        }
        else {
          dVar51 = cfg->luminanceWeight_;
          dVar52 = 0.0;
          dVar49 = 0.0;
          if (uVar26 != uVar4) {
            dVar49 = (double)(int)((uVar26 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
            dVar53 = (double)(int)((uVar26 & 0xff) - (uVar4 & 0xff));
            dVar54 = dVar53 * 0.0722 +
                     (double)(int)((uVar26 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152 +
                     dVar49 * 0.2126;
            dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
            dVar49 = (dVar49 - dVar54) * 0.63500127000254;
            dVar49 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar49 * dVar49 + dVar53 * dVar53);
          }
          if (uVar4 != uVar15) {
            dVar52 = (double)(int)((uVar4 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
            dVar53 = (double)(int)((uVar4 & 0xff) - (uVar15 & 0xff));
            dVar54 = dVar53 * 0.0722 +
                     (double)(int)((uVar4 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) * 0.7152 +
                     dVar52 * 0.2126;
            dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
            dVar52 = (dVar52 - dVar54) * 0.63500127000254;
            dVar52 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar52 * dVar52 + dVar53 * dVar53);
          }
          dVar54 = 0.0;
          dVar53 = 0.0;
          if (uVar33 != uVar5) {
            dVar53 = (double)(int)((uVar33 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
            dVar55 = (double)(int)((uVar33 & 0xff) - (uVar5 & 0xff));
            dVar56 = dVar55 * 0.0722 +
                     (double)(int)((uVar33 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                     dVar53 * 0.2126;
            dVar55 = (dVar55 - dVar56) * 0.5389092476826902;
            dVar53 = (dVar53 - dVar56) * 0.63500127000254;
            dVar53 = SQRT(dVar56 * dVar51 * dVar56 * dVar51 + dVar53 * dVar53 + dVar55 * dVar55);
          }
          if (uVar5 != uVar37) {
            dVar54 = (double)(int)((uVar5 >> 0x10 & 0xff) - (uVar37 >> 0x10 & 0xff));
            dVar55 = (double)(int)((uVar5 & 0xff) - (uVar37 & 0xff));
            dVar56 = dVar55 * 0.0722 +
                     (double)(int)((uVar5 >> 8 & 0xff) - (uVar37 >> 8 & 0xff)) * 0.7152 +
                     dVar54 * 0.2126;
            dVar55 = (dVar55 - dVar56) * 0.5389092476826902;
            dVar54 = (dVar54 - dVar56) * 0.63500127000254;
            dVar54 = SQRT(dVar56 * dVar51 * dVar56 * dVar51 + dVar54 * dVar54 + dVar55 * dVar55);
          }
          dVar56 = 0.0;
          dVar55 = 0.0;
          if (uVar28 != uVar36) {
            dVar55 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar36 >> 0x10 & 0xff));
            dVar57 = (double)(int)((uVar28 & 0xff) - (uVar36 & 0xff));
            dVar58 = dVar57 * 0.0722 +
                     (double)(int)((uVar28 >> 8 & 0xff) - (uVar36 >> 8 & 0xff)) * 0.7152 +
                     dVar55 * 0.2126;
            dVar57 = (dVar57 - dVar58) * 0.5389092476826902;
            dVar55 = (dVar55 - dVar58) * 0.63500127000254;
            dVar55 = SQRT(dVar58 * dVar51 * dVar58 * dVar51 + dVar55 * dVar55 + dVar57 * dVar57) *
                     4.0;
          }
          if (uVar3 != uVar28) {
            dVar56 = (double)(int)((uVar3 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
            dVar57 = (double)(int)((uVar3 & 0xff) - (uVar28 & 0xff));
            dVar58 = dVar57 * 0.0722 +
                     (double)(int)((uVar3 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) * 0.7152 +
                     dVar56 * 0.2126;
            dVar57 = (dVar57 - dVar58) * 0.5389092476826902;
            dVar56 = (dVar56 - dVar58) * 0.63500127000254;
            dVar56 = SQRT(dVar58 * dVar51 * dVar58 * dVar51 + dVar56 * dVar56 + dVar57 * dVar57);
          }
          dVar58 = 0.0;
          dVar57 = 0.0;
          if (uVar28 != uVar32) {
            dVar50 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar32 >> 0x10 & 0xff));
            dVar46 = (double)(int)((uVar28 & 0xff) - (uVar32 & 0xff));
            dVar57 = dVar46 * 0.0722 +
                     (double)(int)((uVar28 >> 8 & 0xff) - (uVar32 >> 8 & 0xff)) * 0.7152 +
                     dVar50 * 0.2126;
            dVar46 = (dVar46 - dVar57) * 0.5389092476826902;
            dVar50 = (dVar50 - dVar57) * 0.63500127000254;
            dVar57 = SQRT(dVar57 * dVar51 * dVar57 * dVar51 + dVar50 * dVar50 + dVar46 * dVar46);
          }
          if (uVar14 != uVar36) {
            dVar58 = (double)(int)((uVar14 >> 0x10 & 0xff) - (uVar36 >> 0x10 & 0xff));
            dVar46 = (double)(int)((uVar14 & 0xff) - (uVar36 & 0xff));
            dVar50 = dVar46 * 0.0722 +
                     (double)(int)((uVar14 >> 8 & 0xff) - (uVar36 >> 8 & 0xff)) * 0.7152 +
                     dVar58 * 0.2126;
            dVar46 = (dVar46 - dVar50) * 0.5389092476826902;
            dVar58 = (dVar58 - dVar50) * 0.63500127000254;
            dVar58 = SQRT(dVar50 * dVar51 * dVar50 * dVar51 + dVar58 * dVar58 + dVar46 * dVar46);
          }
          dVar50 = 0.0;
          dVar46 = 0.0;
          if (uVar36 != uVar30) {
            dVar46 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar30 >> 0x10 & 0xff));
            dVar48 = (double)(int)((uVar36 & 0xff) - (uVar30 & 0xff));
            dVar47 = dVar48 * 0.0722 +
                     (double)(int)((uVar36 >> 8 & 0xff) - (uVar30 >> 8 & 0xff)) * 0.7152 +
                     dVar46 * 0.2126;
            dVar48 = (dVar48 - dVar47) * 0.5389092476826902;
            dVar46 = (dVar46 - dVar47) * 0.63500127000254;
            dVar46 = SQRT(dVar47 * dVar51 * dVar47 * dVar51 + dVar46 * dVar46 + dVar48 * dVar48);
          }
          if (uVar4 != uVar5) {
            dVar48 = (double)(int)((uVar4 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
            dVar50 = (double)(int)((uVar4 & 0xff) - (uVar5 & 0xff));
            dVar47 = dVar50 * 0.0722 +
                     (double)(int)((uVar4 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                     dVar48 * 0.2126;
            dVar50 = (dVar50 - dVar47) * 0.5389092476826902;
            dVar48 = (dVar48 - dVar47) * 0.63500127000254;
            dVar50 = SQRT(dVar47 * dVar51 * dVar47 * dVar51 + dVar48 * dVar48 + dVar50 * dVar50) *
                     4.0;
          }
          dVar55 = dVar52 + dVar49 + dVar53 + dVar54 + dVar55;
          dVar50 = dVar57 + dVar56 + dVar58 + dVar46 + dVar50;
          if (dVar50 <= dVar55) {
            if (dVar55 <= dVar50) {
              uVar35 = 0;
              uVar27 = 0;
            }
            else {
              dVar50 = dVar50 * cfg->dominantDirectionThreshold;
              uVar35 = (ulong)(dVar50 < dVar55) + 1;
              uVar27 = 0x100000000;
              if (dVar50 < dVar55) {
                uVar27 = 0x200000000;
              }
              if (uVar28 == uVar5) {
                uVar35 = 0;
              }
              if (uVar4 == uVar28) {
                uVar35 = 0;
              }
              if (uVar36 == uVar5) {
                uVar27 = 0;
              }
              if (uVar4 == uVar36) {
                uVar27 = 0;
              }
            }
          }
          else {
            dVar55 = dVar55 * cfg->dominantDirectionThreshold;
            uVar27 = (ulong)(dVar55 < dVar50) + 1;
            uVar35 = 0x100000000;
            if (dVar55 < dVar50) {
              uVar35 = 0x200000000;
            }
            if (uVar4 == uVar28) {
              uVar27 = 0;
            }
            if (uVar4 == uVar36) {
              uVar27 = 0;
            }
            if (uVar36 == uVar5) {
              uVar35 = 0;
            }
            if (uVar28 == uVar5) {
              uVar35 = 0;
            }
          }
        }
        bVar2 = *(byte *)((long)__s + uVar39);
        *(byte *)((long)__s + uVar39) = (char)uVar35 * '\x04' | (byte)local_98;
        if (uVar40 < __n) {
          *(byte *)((long)__s + uVar40) = *(byte *)((long)__s + uVar40) | (byte)(uVar27 >> 0x1a);
        }
        cVar22 = (char)uVar27;
        bVar23 = cVar22 << 4 | bVar2;
        local_98 = uVar35 >> 0x20;
        uVar6 = src[lVar18 + uVar39];
        iVar16 = 3;
        puVar29 = local_90;
        do {
          puVar29[-2] = uVar6;
          puVar29[-1] = uVar6;
          *puVar29 = uVar6;
          puVar29 = (uint32_t *)((long)puVar29 + (long)(srcWidth * 0xc));
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
        if (bVar23 != 0) {
          uVar14 = src[(long)iVar24 + uVar43];
          uVar15 = src[(long)iVar24 + uVar39];
          uVar3 = src[iVar24 + lVar34];
          uVar4 = src[lVar18 + uVar43];
          uVar36 = src[lVar18 + uVar39];
          uVar37 = src[lVar18 + lVar34];
          uVar26 = src[(long)iVar25 + uVar43];
          uVar28 = src[(long)iVar25 + uVar39];
          uVar5 = src[iVar25 + lVar34];
          if (cVar22 != '\0' || (bVar2 & 0x30) != 0) {
            bVar45 = true;
            if ((bVar23 & 0x20) == 0) {
              if ((bVar2 & 0xc) == 0) {
LAB_00441bb9:
                if (0x3f < bVar23) {
                  dVar51 = 0.0;
                  if (uVar36 != uVar3) {
                    dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar3 >> 0x10 & 0xff));
                    dVar51 = (double)(int)((uVar36 & 0xff) - (uVar3 & 0xff));
                    dVar49 = dVar51 * 0.0722 +
                             (double)(int)((uVar36 >> 8 & 0xff) - (uVar3 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                    dVar49 = dVar49 * cfg->luminanceWeight_;
                    dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                  }
                  if (cfg->equalColorTolerance_ <= dVar51) goto LAB_00442086;
                }
                dVar51 = 0.0;
                if (uVar26 != uVar28) {
                  dVar52 = (double)(int)((uVar26 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
                  dVar51 = (double)(int)((uVar26 & 0xff) - (uVar28 & 0xff));
                  dVar49 = dVar51 * 0.0722 +
                           (double)(int)((uVar26 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                  dVar49 = dVar49 * cfg->luminanceWeight_;
                  dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                }
                dVar49 = cfg->equalColorTolerance_;
                if (dVar51 < dVar49) {
                  dVar51 = 0.0;
                  if (uVar28 != uVar5) {
                    dVar53 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                    dVar51 = (double)(int)((uVar28 & 0xff) - (uVar5 & 0xff));
                    dVar52 = dVar51 * 0.0722 +
                             (double)(int)((uVar28 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                             dVar53 * 0.2126;
                    dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                    dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                    dVar52 = dVar52 * cfg->luminanceWeight_;
                    dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                  }
                  if (dVar51 < dVar49) {
                    dVar51 = 0.0;
                    if (uVar5 != uVar37) {
                      dVar53 = (double)(int)((uVar5 >> 0x10 & 0xff) - (uVar37 >> 0x10 & 0xff));
                      dVar51 = (double)(int)((uVar5 & 0xff) - (uVar37 & 0xff));
                      dVar52 = dVar51 * 0.0722 +
                               (double)(int)((uVar5 >> 8 & 0xff) - (uVar37 >> 8 & 0xff)) * 0.7152 +
                               dVar53 * 0.2126;
                      dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                      dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                      dVar52 = dVar52 * cfg->luminanceWeight_;
                      dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                    }
                    if (dVar51 < dVar49) {
                      dVar51 = 0.0;
                      if (uVar37 != uVar3) {
                        dVar53 = (double)(int)((uVar37 >> 0x10 & 0xff) - (uVar3 >> 0x10 & 0xff));
                        dVar51 = (double)(int)((uVar37 & 0xff) - (uVar3 & 0xff));
                        dVar52 = dVar51 * 0.0722 +
                                 (double)(int)((uVar37 >> 8 & 0xff) - (uVar3 >> 8 & 0xff)) * 0.7152
                                 + dVar53 * 0.2126;
                        dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                        dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                        dVar52 = dVar52 * cfg->luminanceWeight_;
                        dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                      }
                      if (dVar51 < dVar49) {
                        dVar51 = 0.0;
                        if (uVar36 != uVar5) {
                          dVar53 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                          dVar51 = (double)(int)((uVar36 & 0xff) - (uVar5 & 0xff));
                          dVar52 = dVar51 * 0.0722 +
                                   (double)(int)((uVar36 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) *
                                   0.7152 + dVar53 * 0.2126;
                          dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                          dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                          dVar52 = dVar52 * cfg->luminanceWeight_;
                          dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                        }
                        if (dVar49 <= dVar51) goto LAB_00442086;
                      }
                    }
                  }
                }
              }
              else {
                dVar51 = 0.0;
                if (uVar36 != uVar26) {
                  dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar26 >> 0x10 & 0xff));
                  dVar51 = (double)(int)((uVar36 & 0xff) - (uVar26 & 0xff));
                  dVar49 = dVar51 * 0.0722 +
                           (double)(int)((uVar36 >> 8 & 0xff) - (uVar26 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                  dVar49 = dVar49 * cfg->luminanceWeight_;
                  dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                }
                if (dVar51 < cfg->equalColorTolerance_) goto LAB_00441bb9;
LAB_00442086:
                bVar45 = false;
              }
            }
            dVar51 = cfg->luminanceWeight_;
            dVar49 = 0.0;
            dVar52 = 0.0;
            if (uVar36 != uVar37) {
              dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar37 >> 0x10 & 0xff));
              dVar53 = (double)(int)((uVar36 & 0xff) - (uVar37 & 0xff));
              dVar54 = dVar53 * 0.0722 +
                       (double)(int)((uVar36 >> 8 & 0xff) - (uVar37 >> 8 & 0xff)) * 0.7152 +
                       dVar52 * 0.2126;
              dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
              dVar52 = (dVar52 - dVar54) * 0.63500127000254;
              dVar52 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar52 * dVar52 + dVar53 * dVar53);
            }
            if (uVar36 != uVar28) {
              dVar49 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
              dVar53 = (double)(int)((uVar36 & 0xff) - (uVar28 & 0xff));
              dVar54 = dVar53 * 0.0722 +
                       (double)(int)((uVar36 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) * 0.7152 +
                       dVar49 * 0.2126;
              dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
              dVar49 = (dVar49 - dVar54) * 0.63500127000254;
              dVar49 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar49 * dVar49 + dVar53 * dVar53);
            }
            uVar30 = uVar37;
            if (dVar49 < dVar52) {
              uVar30 = uVar28;
            }
            if (bVar45) {
              dVar52 = 0.0;
              dVar49 = 0.0;
              if (uVar37 != uVar26) {
                dVar49 = (double)(int)((uVar37 >> 0x10 & 0xff) - (uVar26 >> 0x10 & 0xff));
                dVar53 = (double)(int)((uVar37 & 0xff) - (uVar26 & 0xff));
                dVar54 = dVar53 * 0.0722 +
                         (double)(int)((uVar37 >> 8 & 0xff) - (uVar26 >> 8 & 0xff)) * 0.7152 +
                         dVar49 * 0.2126;
                dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
                dVar49 = (dVar49 - dVar54) * 0.63500127000254;
                dVar49 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar49 * dVar49 + dVar53 * dVar53)
                ;
              }
              if (uVar28 != uVar3) {
                dVar52 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar3 >> 0x10 & 0xff));
                dVar53 = (double)(int)((uVar28 & 0xff) - (uVar3 & 0xff));
                dVar54 = dVar53 * 0.0722 +
                         (double)(int)((uVar28 >> 8 & 0xff) - (uVar3 >> 8 & 0xff)) * 0.7152 +
                         dVar52 * 0.2126;
                dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
                dVar52 = (dVar52 - dVar54) * 0.63500127000254;
                dVar52 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar52 * dVar52 + dVar53 * dVar53)
                ;
              }
              bVar45 = dVar49 < cfg->steepDirectionThreshold * dVar52;
              if (((dVar52 < cfg->steepDirectionThreshold * dVar49) || (uVar36 == uVar26)) ||
                 (uVar4 == uVar26)) {
                if ((uVar15 == uVar3 || uVar36 == uVar3) || bVar45) {
                  uVar38 = uVar30 >> 0x18;
                  uVar33 = puVar21[uVar13 + 2];
                  uVar41 = ((uVar33 >> 0x18) * 7 + uVar38 & 0xfffffff8) << 0x15;
                  uVar32 = uVar41;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar32 = 0xff000000;
                  }
                  if (uVar38 != 0xff) {
                    uVar32 = uVar41;
                  }
                  uVar42 = uVar30 & 0xff0000;
                  uVar44 = uVar30 & 0xff00;
                  uVar30 = uVar30 & 0xff;
                  puVar21[uVar13 + 2] =
                       ((uVar33 & 0xff0000) * 7 + uVar42 & 0x7f80000 |
                       (uVar33 & 0xff00) * 7 + uVar44 & 0x7f800 | (uVar33 & 0xff) * 7 + uVar30) >> 3
                       | uVar32;
                  uVar33 = puVar21[uVar13 * 2 + 2];
                  uVar41 = (uVar38 * 7 + (uVar33 >> 0x18) & 0xfffffff8) << 0x15;
                  uVar32 = uVar41;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar32 = 0xff000000;
                  }
                  uVar19 = puVar21[uVar13 * 2 + 1];
                  if (uVar38 != 0xff) {
                    uVar32 = uVar41;
                  }
                  uVar20 = ((uVar19 >> 0x18) * 7 + uVar38 & 0xfffffff8) << 0x15;
                  uVar41 = uVar20;
                  if (uVar19 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar38 != 0xff) {
                    uVar41 = uVar20;
                  }
                  puVar21[uVar13 * 2 + 1] =
                       ((uVar19 & 0xff0000) * 7 + uVar42 & 0x7f80000 |
                       (uVar19 & 0xff00) * 7 + uVar44 & 0x7f800 | (uVar19 & 0xff) * 7 + uVar30) >> 3
                       | uVar41;
                  puVar21[uVar13 * 2 + 2] =
                       ((uVar33 & 0xff0000) + uVar42 * 7 & 0x7f80000 |
                       (uVar33 & 0xff00) + uVar44 * 7 & 0x7f800 | (uVar33 & 0xff) + uVar30 * 7) >> 3
                       | uVar32;
                }
                else {
                  uVar41 = uVar30 >> 0x18;
                  uVar33 = puVar21[2];
                  uVar38 = ((uVar33 >> 0x18) * 3 + uVar41 & 0xfffffffc) << 0x16;
                  uVar32 = uVar38;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar32 = 0xff000000;
                  }
                  if (uVar41 != 0xff) {
                    uVar32 = uVar38;
                  }
                  uVar42 = uVar30 & 0xff0000;
                  uVar44 = uVar30 & 0xff00;
                  uVar19 = uVar30 & 0xff;
                  puVar21[2] = ((uVar33 & 0xff0000) * 3 + uVar42 & 0x3fc0000 |
                               (uVar33 & 0xff00) * 3 + uVar44 & 0x3fc00 |
                               (uVar33 & 0xff) * 3 + uVar19) >> 2 | uVar32;
                  uVar33 = puVar21[uVar13 * 2 + 1];
                  uVar38 = ((uVar33 >> 0x18) * 3 + uVar41 & 0xfffffffc) << 0x16;
                  uVar32 = uVar38;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar32 = 0xff000000;
                  }
                  if (uVar41 != 0xff) {
                    uVar32 = uVar38;
                  }
                  puVar21[uVar13 * 2 + 1] =
                       ((uVar33 & 0xff0000) * 3 + uVar42 & 0x3fc0000 |
                       (uVar33 & 0xff00) * 3 + uVar44 & 0x3fc00 | (uVar33 & 0xff) * 3 + uVar19) >> 2
                       | uVar32;
                  uVar33 = puVar21[uVar13 + 2];
                  uVar38 = (uVar41 * 3 + (uVar33 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar32 = uVar38;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar32 = 0xff000000;
                  }
                  if (uVar41 != 0xff) {
                    uVar32 = uVar38;
                  }
                  puVar21[uVar13 + 2] =
                       ((uVar33 & 0xff0000) + uVar42 * 3 & 0x3fc0000 |
                       (uVar33 & 0xff00) + uVar44 * 3 & 0x3fc00 | (uVar33 & 0xff) + uVar19 * 3) >> 2
                       | uVar32;
                  puVar21[uVar13 * 2 + 2] = uVar30;
                }
              }
              else {
                uVar32 = uVar30 >> 0x18;
                uVar33 = puVar21[uVar13 * 2];
                uVar41 = ((uVar33 >> 0x18) * 3 + uVar32 & 0xfffffffc) << 0x16;
                if (uVar33 >> 0x18 == 0xff && uVar32 == 0xff) {
                  uVar41 = 0xff000000;
                }
                uVar44 = uVar30 & 0xff00;
                uVar42 = uVar30 & 0xff;
                uVar38 = uVar30 & 0xff0000;
                puVar21[uVar13 * 2] =
                     ((uVar33 & 0xff0000) * 3 + uVar38 & 0x3fc0000 |
                     (uVar33 & 0xff00) * 3 + uVar44 & 0x3fc00 | (uVar33 & 0xff) * 3 + uVar42) >> 2 |
                     uVar41;
                if ((uVar15 == uVar3 || uVar36 == uVar3) || bVar45) {
                  uVar33 = puVar21[uVar13 + 2];
                  uVar19 = ((uVar33 >> 0x18) * 3 + uVar32 & 0xfffffffc) << 0x16;
                  uVar41 = uVar19;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar32 != 0xff) {
                    uVar41 = uVar19;
                  }
                  puVar21[uVar13 + 2] =
                       ((uVar33 & 0xff0000) * 3 + uVar38 & 0x3fc0000 |
                       (uVar33 & 0xff00) * 3 + uVar44 & 0x3fc00 | (uVar33 & 0xff) * 3 + uVar42) >> 2
                       | uVar41;
                  uVar33 = puVar21[uVar13 * 2 + 1];
                  uVar19 = (uVar32 * 3 + (uVar33 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar41 = uVar19;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar32 != 0xff) {
                    uVar41 = uVar19;
                  }
                  puVar21[uVar13 * 2 + 1] =
                       ((uVar33 & 0xff0000) + uVar38 * 3 & 0x3fc0000 |
                       (uVar33 & 0xff00) + uVar44 * 3 & 0x3fc00 | (uVar33 & 0xff) + uVar42 * 3) >> 2
                       | uVar41;
                }
                else {
                  uVar33 = puVar21[2];
                  uVar19 = ((uVar33 >> 0x18) * 3 + uVar32 & 0xfffffffc) << 0x16;
                  uVar41 = uVar19;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar32 != 0xff) {
                    uVar41 = uVar19;
                  }
                  puVar21[2] = ((uVar33 & 0xff0000) * 3 + uVar38 & 0x3fc0000 |
                               (uVar33 & 0xff00) * 3 + uVar44 & 0x3fc00 |
                               (uVar33 & 0xff) * 3 + uVar42) >> 2 | uVar41;
                  uVar33 = puVar21[uVar13 * 2 + 1];
                  uVar19 = ((uVar33 >> 0x18) + uVar32 * 3 & 0xfffffffc) << 0x16;
                  uVar41 = uVar19;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar32 != 0xff) {
                    uVar41 = uVar19;
                  }
                  puVar21[uVar13 * 2 + 1] =
                       ((uVar33 & 0xff0000) + uVar38 * 3 & 0x3fc0000 |
                       (uVar33 & 0xff00) + uVar44 * 3 & 0x3fc00 | (uVar33 & 0xff) + uVar42 * 3) >> 2
                       | uVar41;
                  uVar33 = puVar21[uVar13 + 2];
                  uVar19 = (uVar32 * 3 + (uVar33 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar41 = uVar19;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar32 != 0xff) {
                    uVar41 = uVar19;
                  }
                  puVar21[uVar13 + 2] =
                       ((uVar33 & 0xff0000) + uVar38 * 3 & 0x3fc0000 |
                       (uVar33 & 0xff00) + uVar44 * 3 & 0x3fc00 | (uVar33 & 0xff) + uVar42 * 3) >> 2
                       | uVar41;
                }
                puVar21[uVar13 * 2 + 2] = uVar30;
              }
            }
            else {
              uVar33 = puVar21[uVar13 * 2 + 2];
              if ((uVar30 >> 0x18 != 0xff) || (uVar32 = 0xff000000, uVar33 >> 0x18 != 0xff)) {
                uVar32 = ((uVar33 >> 0x18) * 0x37 + (uVar30 >> 0x18) * 0x2d) * 0x28f60 & 0xff000000;
              }
              puVar21[uVar13 * 2 + 2] =
                   ((uVar33 & 0xff) * 0x37 + (uVar30 & 0xff) * 0x2d) / 100 | uVar32 |
                   ((uVar33 & 0xff00) * 0x37 + (uVar30 & 0xff00) * 0x2d) / 100 & 0xff00 |
                   ((uVar33 & 0xff0000) * 0x37 + (uVar30 & 0xff0000) * 0x2d) / 100 & 0xff0000;
            }
          }
          if ((bVar2 & 0xc) != 0) {
            bVar45 = true;
            if ((bVar2 & 8) == 0) {
              if ((bVar2 & 3) == 0) {
LAB_00442c72:
                if (0x3f < (byte)(bVar23 << 2 | bVar2 >> 6)) {
                  dVar51 = 0.0;
                  if (uVar36 != uVar14) {
                    dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar14 >> 0x10 & 0xff));
                    dVar51 = (double)(int)((uVar36 & 0xff) - (uVar14 & 0xff));
                    dVar49 = dVar51 * 0.0722 +
                             (double)(int)((uVar36 >> 8 & 0xff) - (uVar14 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                    dVar49 = dVar49 * cfg->luminanceWeight_;
                    dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                  }
                  if (cfg->equalColorTolerance_ <= dVar51) goto LAB_00443139;
                }
                dVar51 = 0.0;
                if (uVar5 != uVar37) {
                  dVar52 = (double)(int)((uVar5 >> 0x10 & 0xff) - (uVar37 >> 0x10 & 0xff));
                  dVar51 = (double)(int)((uVar5 & 0xff) - (uVar37 & 0xff));
                  dVar49 = dVar51 * 0.0722 +
                           (double)(int)((uVar5 >> 8 & 0xff) - (uVar37 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                  dVar49 = dVar49 * cfg->luminanceWeight_;
                  dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                }
                dVar49 = cfg->equalColorTolerance_;
                if (dVar51 < dVar49) {
                  dVar51 = 0.0;
                  if (uVar37 != uVar3) {
                    dVar53 = (double)(int)((uVar37 >> 0x10 & 0xff) - (uVar3 >> 0x10 & 0xff));
                    dVar51 = (double)(int)((uVar37 & 0xff) - (uVar3 & 0xff));
                    dVar52 = dVar51 * 0.0722 +
                             (double)(int)((uVar37 >> 8 & 0xff) - (uVar3 >> 8 & 0xff)) * 0.7152 +
                             dVar53 * 0.2126;
                    dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                    dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                    dVar52 = dVar52 * cfg->luminanceWeight_;
                    dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                  }
                  if (dVar51 < dVar49) {
                    dVar51 = 0.0;
                    if (uVar3 != uVar15) {
                      dVar53 = (double)(int)((uVar3 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
                      dVar51 = (double)(int)((uVar3 & 0xff) - (uVar15 & 0xff));
                      dVar52 = dVar51 * 0.0722 +
                               (double)(int)((uVar3 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) * 0.7152 +
                               dVar53 * 0.2126;
                      dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                      dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                      dVar52 = dVar52 * cfg->luminanceWeight_;
                      dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                    }
                    if (dVar51 < dVar49) {
                      dVar51 = 0.0;
                      if (uVar15 != uVar14) {
                        dVar53 = (double)(int)((uVar15 >> 0x10 & 0xff) - (uVar14 >> 0x10 & 0xff));
                        dVar51 = (double)(int)((uVar15 & 0xff) - (uVar14 & 0xff));
                        dVar52 = dVar51 * 0.0722 +
                                 (double)(int)((uVar15 >> 8 & 0xff) - (uVar14 >> 8 & 0xff)) * 0.7152
                                 + dVar53 * 0.2126;
                        dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                        dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                        dVar52 = dVar52 * cfg->luminanceWeight_;
                        dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                      }
                      if (dVar51 < dVar49) {
                        dVar51 = 0.0;
                        if (uVar36 != uVar3) {
                          dVar53 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar3 >> 0x10 & 0xff));
                          dVar51 = (double)(int)((uVar36 & 0xff) - (uVar3 & 0xff));
                          dVar52 = dVar51 * 0.0722 +
                                   (double)(int)((uVar36 >> 8 & 0xff) - (uVar3 >> 8 & 0xff)) *
                                   0.7152 + dVar53 * 0.2126;
                          dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                          dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                          dVar52 = dVar52 * cfg->luminanceWeight_;
                          dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                        }
                        if (dVar49 <= dVar51) goto LAB_00443139;
                      }
                    }
                  }
                }
              }
              else {
                dVar51 = 0.0;
                if (uVar36 != uVar5) {
                  dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                  dVar51 = (double)(int)((uVar36 & 0xff) - (uVar5 & 0xff));
                  dVar49 = dVar51 * 0.0722 +
                           (double)(int)((uVar36 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                  dVar49 = dVar49 * cfg->luminanceWeight_;
                  dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                }
                if (dVar51 < cfg->equalColorTolerance_) goto LAB_00442c72;
LAB_00443139:
                bVar45 = false;
              }
            }
            dVar51 = cfg->luminanceWeight_;
            dVar49 = 0.0;
            dVar52 = 0.0;
            if (uVar36 != uVar15) {
              dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
              dVar53 = (double)(int)((uVar36 & 0xff) - (uVar15 & 0xff));
              dVar54 = dVar53 * 0.0722 +
                       (double)(int)((uVar36 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) * 0.7152 +
                       dVar52 * 0.2126;
              dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
              dVar52 = (dVar52 - dVar54) * 0.63500127000254;
              dVar52 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar52 * dVar52 + dVar53 * dVar53);
            }
            if (uVar36 != uVar37) {
              dVar49 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar37 >> 0x10 & 0xff));
              dVar53 = (double)(int)((uVar36 & 0xff) - (uVar37 & 0xff));
              dVar54 = dVar53 * 0.0722 +
                       (double)(int)((uVar36 >> 8 & 0xff) - (uVar37 >> 8 & 0xff)) * 0.7152 +
                       dVar49 * 0.2126;
              dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
              dVar49 = (dVar49 - dVar54) * 0.63500127000254;
              dVar49 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar49 * dVar49 + dVar53 * dVar53);
            }
            uVar30 = uVar15;
            if (dVar49 < dVar52) {
              uVar30 = uVar37;
            }
            if (bVar45) {
              dVar52 = 0.0;
              dVar49 = 0.0;
              if (uVar15 != uVar5) {
                dVar49 = (double)(int)((uVar15 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                dVar53 = (double)(int)((uVar15 & 0xff) - (uVar5 & 0xff));
                dVar54 = dVar53 * 0.0722 +
                         (double)(int)((uVar15 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                         dVar49 * 0.2126;
                dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
                dVar49 = (dVar49 - dVar54) * 0.63500127000254;
                dVar49 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar49 * dVar49 + dVar53 * dVar53)
                ;
              }
              if (uVar37 != uVar14) {
                dVar52 = (double)(int)((uVar37 >> 0x10 & 0xff) - (uVar14 >> 0x10 & 0xff));
                dVar53 = (double)(int)((uVar37 & 0xff) - (uVar14 & 0xff));
                dVar54 = dVar53 * 0.0722 +
                         (double)(int)((uVar37 >> 8 & 0xff) - (uVar14 >> 8 & 0xff)) * 0.7152 +
                         dVar52 * 0.2126;
                dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
                dVar52 = (dVar52 - dVar54) * 0.63500127000254;
                dVar52 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar52 * dVar52 + dVar53 * dVar53)
                ;
              }
              bVar45 = dVar49 < cfg->steepDirectionThreshold * dVar52;
              if (((dVar52 < cfg->steepDirectionThreshold * dVar49) || (uVar36 == uVar5)) ||
                 (uVar28 == uVar5)) {
                uVar33 = uVar30 >> 0x18;
                if ((uVar4 == uVar14 || uVar36 == uVar14) || bVar45) {
                  uVar32 = puVar21[1];
                  uVar38 = ((uVar32 >> 0x18) * 7 + uVar33 & 0xfffffff8) << 0x15;
                  uVar41 = uVar38;
                  if (uVar32 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar33 != 0xff) {
                    uVar41 = uVar38;
                  }
                  uVar42 = uVar30 & 0xff0000;
                  uVar44 = uVar30 & 0xff00;
                  uVar30 = uVar30 & 0xff;
                  puVar21[1] = ((uVar32 & 0xff0000) * 7 + uVar42 & 0x7f80000 |
                               (uVar32 & 0xff00) * 7 + uVar44 & 0x7f800 |
                               (uVar32 & 0xff) * 7 + uVar30) >> 3 | uVar41;
                  uVar32 = puVar21[uVar13 + 2];
                  uVar38 = ((uVar32 >> 0x18) * 7 + uVar33 & 0xfffffff8) << 0x15;
                  uVar41 = uVar38;
                  if (uVar32 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar33 != 0xff) {
                    uVar41 = uVar38;
                  }
                  puVar21[uVar13 + 2] =
                       ((uVar32 & 0xff0000) * 7 + uVar42 & 0x7f80000 |
                       (uVar32 & 0xff00) * 7 + uVar44 & 0x7f800 | (uVar32 & 0xff) * 7 + uVar30) >> 3
                       | uVar41;
                  uVar32 = puVar21[2];
                  uVar38 = (uVar33 * 7 + (uVar32 >> 0x18) & 0xfffffff8) << 0x15;
                  uVar41 = uVar38;
                  if (uVar32 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar33 != 0xff) {
                    uVar41 = uVar38;
                  }
                  puVar21[2] = ((uVar32 & 0xff0000) + uVar42 * 7 & 0x7f80000 |
                               (uVar32 & 0xff00) + uVar44 * 7 & 0x7f800 |
                               (uVar32 & 0xff) + uVar30 * 7) >> 3 | uVar41;
                }
                else {
                  uVar32 = *puVar21;
                  uVar38 = ((uVar32 >> 0x18) * 3 + uVar33 & 0xfffffffc) << 0x16;
                  uVar41 = uVar38;
                  if (uVar32 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar33 != 0xff) {
                    uVar41 = uVar38;
                  }
                  uVar42 = uVar30 & 0xff0000;
                  uVar44 = uVar30 & 0xff00;
                  uVar19 = uVar30 & 0xff;
                  *puVar21 = ((uVar32 & 0xff0000) * 3 + uVar42 & 0x3fc0000 |
                             (uVar32 & 0xff00) * 3 + uVar44 & 0x3fc00 | (uVar32 & 0xff) * 3 + uVar19
                             ) >> 2 | uVar41;
                  uVar32 = puVar21[uVar13 + 2];
                  uVar38 = ((uVar32 >> 0x18) * 3 + uVar33 & 0xfffffffc) << 0x16;
                  uVar41 = uVar38;
                  if (uVar32 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar33 != 0xff) {
                    uVar41 = uVar38;
                  }
                  puVar21[uVar13 + 2] =
                       ((uVar32 & 0xff0000) * 3 + uVar42 & 0x3fc0000 |
                       (uVar32 & 0xff00) * 3 + uVar44 & 0x3fc00 | (uVar32 & 0xff) * 3 + uVar19) >> 2
                       | uVar41;
                  uVar32 = puVar21[1];
                  uVar38 = (uVar33 * 3 + (uVar32 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar41 = uVar38;
                  if (uVar32 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar33 != 0xff) {
                    uVar41 = uVar38;
                  }
                  puVar21[1] = ((uVar32 & 0xff0000) + uVar42 * 3 & 0x3fc0000 |
                               (uVar32 & 0xff00) + uVar44 * 3 & 0x3fc00 |
                               (uVar32 & 0xff) + uVar19 * 3) >> 2 | uVar41;
                  puVar21[2] = uVar30;
                }
              }
              else {
                uVar32 = uVar30 >> 0x18;
                uVar33 = puVar21[uVar13 * 2 + 2];
                uVar41 = ((uVar33 >> 0x18) * 3 + uVar32 & 0xfffffffc) << 0x16;
                if (uVar33 >> 0x18 == 0xff && uVar32 == 0xff) {
                  uVar41 = 0xff000000;
                }
                uVar44 = uVar30 & 0xff00;
                uVar42 = uVar30 & 0xff;
                uVar38 = uVar30 & 0xff0000;
                puVar21[uVar13 * 2 + 2] =
                     ((uVar33 & 0xff0000) * 3 + uVar38 & 0x3fc0000 |
                     (uVar33 & 0xff00) * 3 + uVar44 & 0x3fc00 | (uVar33 & 0xff) * 3 + uVar42) >> 2 |
                     uVar41;
                if ((uVar4 == uVar14 || uVar36 == uVar14) || bVar45) {
                  uVar33 = puVar21[1];
                  uVar19 = ((uVar33 >> 0x18) * 3 + uVar32 & 0xfffffffc) << 0x16;
                  uVar41 = uVar19;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar32 != 0xff) {
                    uVar41 = uVar19;
                  }
                  puVar21[1] = ((uVar33 & 0xff0000) * 3 + uVar38 & 0x3fc0000 |
                               (uVar33 & 0xff00) * 3 + uVar44 & 0x3fc00 |
                               (uVar33 & 0xff) * 3 + uVar42) >> 2 | uVar41;
                  uVar33 = puVar21[uVar13 + 2];
                  uVar19 = (uVar32 * 3 + (uVar33 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar41 = uVar19;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar32 != 0xff) {
                    uVar41 = uVar19;
                  }
                  puVar21[uVar13 + 2] =
                       ((uVar33 & 0xff0000) + uVar38 * 3 & 0x3fc0000 |
                       (uVar33 & 0xff00) + uVar44 * 3 & 0x3fc00 | (uVar33 & 0xff) + uVar42 * 3) >> 2
                       | uVar41;
                }
                else {
                  uVar33 = *puVar21;
                  uVar19 = ((uVar33 >> 0x18) * 3 + uVar32 & 0xfffffffc) << 0x16;
                  uVar41 = uVar19;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar32 != 0xff) {
                    uVar41 = uVar19;
                  }
                  *puVar21 = ((uVar33 & 0xff0000) * 3 + uVar38 & 0x3fc0000 |
                             (uVar33 & 0xff00) * 3 + uVar44 & 0x3fc00 | (uVar33 & 0xff) * 3 + uVar42
                             ) >> 2 | uVar41;
                  uVar33 = puVar21[uVar13 + 2];
                  uVar19 = ((uVar33 >> 0x18) + uVar32 * 3 & 0xfffffffc) << 0x16;
                  uVar41 = uVar19;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar32 != 0xff) {
                    uVar41 = uVar19;
                  }
                  puVar21[uVar13 + 2] =
                       ((uVar33 & 0xff0000) + uVar38 * 3 & 0x3fc0000 |
                       (uVar33 & 0xff00) + uVar44 * 3 & 0x3fc00 | (uVar33 & 0xff) + uVar42 * 3) >> 2
                       | uVar41;
                  uVar33 = puVar21[1];
                  uVar19 = (uVar32 * 3 + (uVar33 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar41 = uVar19;
                  if (uVar33 >> 0x18 == 0xff) {
                    uVar41 = 0xff000000;
                  }
                  if (uVar32 != 0xff) {
                    uVar41 = uVar19;
                  }
                  puVar21[1] = ((uVar33 & 0xff0000) + uVar38 * 3 & 0x3fc0000 |
                               (uVar33 & 0xff00) + uVar44 * 3 & 0x3fc00 |
                               (uVar33 & 0xff) + uVar42 * 3) >> 2 | uVar41;
                }
                puVar21[2] = uVar30;
              }
            }
            else {
              uVar33 = puVar21[2];
              if ((uVar30 >> 0x18 != 0xff) || (uVar32 = 0xff000000, uVar33 >> 0x18 != 0xff)) {
                uVar32 = ((uVar33 >> 0x18) * 0x37 + (uVar30 >> 0x18) * 0x2d) * 0x28f60 & 0xff000000;
              }
              puVar21[2] = ((uVar33 & 0xff) * 0x37 + (uVar30 & 0xff) * 0x2d) / 100 | uVar32 |
                           ((uVar33 & 0xff00) * 0x37 + (uVar30 & 0xff00) * 0x2d) / 100 & 0xff00 |
                           ((uVar33 & 0xff0000) * 0x37 + (uVar30 & 0xff0000) * 0x2d) / 100 &
                           0xff0000;
            }
          }
          bVar7 = bVar2 << 4;
          if ((bVar7 & 0x30) != 0) {
            bVar45 = true;
            if ((bVar7 & 0x20) == 0) {
              if ((bVar2 & 0xc0) == 0) {
LAB_00443d0d:
                if (0x3f < (byte)(bVar7 | bVar23 >> 4)) {
                  dVar51 = 0.0;
                  if (uVar36 != uVar26) {
                    dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar26 >> 0x10 & 0xff));
                    dVar51 = (double)(int)((uVar36 & 0xff) - (uVar26 & 0xff));
                    dVar49 = dVar51 * 0.0722 +
                             (double)(int)((uVar36 >> 8 & 0xff) - (uVar26 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                    dVar49 = dVar49 * cfg->luminanceWeight_;
                    dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                  }
                  if (cfg->equalColorTolerance_ <= dVar51) goto LAB_004441db;
                }
                dVar51 = 0.0;
                if (uVar3 != uVar15) {
                  dVar52 = (double)(int)((uVar3 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
                  dVar51 = (double)(int)((uVar3 & 0xff) - (uVar15 & 0xff));
                  dVar49 = dVar51 * 0.0722 +
                           (double)(int)((uVar3 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                  dVar49 = dVar49 * cfg->luminanceWeight_;
                  dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                }
                dVar49 = cfg->equalColorTolerance_;
                if (dVar51 < dVar49) {
                  dVar51 = 0.0;
                  if (uVar15 != uVar14) {
                    dVar53 = (double)(int)((uVar15 >> 0x10 & 0xff) - (uVar14 >> 0x10 & 0xff));
                    dVar51 = (double)(int)((uVar15 & 0xff) - (uVar14 & 0xff));
                    dVar52 = dVar51 * 0.0722 +
                             (double)(int)((uVar15 >> 8 & 0xff) - (uVar14 >> 8 & 0xff)) * 0.7152 +
                             dVar53 * 0.2126;
                    dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                    dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                    dVar52 = dVar52 * cfg->luminanceWeight_;
                    dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                  }
                  if (dVar51 < dVar49) {
                    dVar51 = 0.0;
                    if (uVar14 != uVar4) {
                      dVar53 = (double)(int)((uVar14 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
                      dVar51 = (double)(int)((uVar14 & 0xff) - (uVar4 & 0xff));
                      dVar52 = dVar51 * 0.0722 +
                               (double)(int)((uVar14 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152 +
                               dVar53 * 0.2126;
                      dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                      dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                      dVar52 = dVar52 * cfg->luminanceWeight_;
                      dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                    }
                    if (dVar51 < dVar49) {
                      dVar51 = 0.0;
                      if (uVar4 != uVar26) {
                        dVar53 = (double)(int)((uVar4 >> 0x10 & 0xff) - (uVar26 >> 0x10 & 0xff));
                        dVar51 = (double)(int)((uVar4 & 0xff) - (uVar26 & 0xff));
                        dVar52 = dVar51 * 0.0722 +
                                 (double)(int)((uVar4 >> 8 & 0xff) - (uVar26 >> 8 & 0xff)) * 0.7152
                                 + dVar53 * 0.2126;
                        dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                        dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                        dVar52 = dVar52 * cfg->luminanceWeight_;
                        dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                      }
                      if (dVar51 < dVar49) {
                        dVar51 = 0.0;
                        if (uVar36 != uVar14) {
                          dVar53 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar14 >> 0x10 & 0xff));
                          dVar51 = (double)(int)((uVar36 & 0xff) - (uVar14 & 0xff));
                          dVar52 = dVar51 * 0.0722 +
                                   (double)(int)((uVar36 >> 8 & 0xff) - (uVar14 >> 8 & 0xff)) *
                                   0.7152 + dVar53 * 0.2126;
                          dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                          dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                          dVar52 = dVar52 * cfg->luminanceWeight_;
                          dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                        }
                        if (dVar49 <= dVar51) goto LAB_004441db;
                      }
                    }
                  }
                }
              }
              else {
                dVar51 = 0.0;
                if (uVar36 != uVar3) {
                  dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar3 >> 0x10 & 0xff));
                  dVar51 = (double)(int)((uVar36 & 0xff) - (uVar3 & 0xff));
                  dVar49 = dVar51 * 0.0722 +
                           (double)(int)((uVar36 >> 8 & 0xff) - (uVar3 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                  dVar49 = dVar49 * cfg->luminanceWeight_;
                  dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                }
                if (dVar51 < cfg->equalColorTolerance_) goto LAB_00443d0d;
LAB_004441db:
                bVar45 = false;
              }
            }
            dVar51 = cfg->luminanceWeight_;
            dVar49 = 0.0;
            dVar52 = 0.0;
            if (uVar36 != uVar4) {
              dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
              dVar53 = (double)(int)((uVar36 & 0xff) - (uVar4 & 0xff));
              dVar54 = dVar53 * 0.0722 +
                       (double)(int)((uVar36 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152 +
                       dVar52 * 0.2126;
              dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
              dVar52 = (dVar52 - dVar54) * 0.63500127000254;
              dVar52 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar52 * dVar52 + dVar53 * dVar53);
            }
            if (uVar36 != uVar15) {
              dVar49 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar15 >> 0x10 & 0xff));
              dVar53 = (double)(int)((uVar36 & 0xff) - (uVar15 & 0xff));
              dVar54 = dVar53 * 0.0722 +
                       (double)(int)((uVar36 >> 8 & 0xff) - (uVar15 >> 8 & 0xff)) * 0.7152 +
                       dVar49 * 0.2126;
              dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
              dVar49 = (dVar49 - dVar54) * 0.63500127000254;
              dVar49 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar49 * dVar49 + dVar53 * dVar53);
            }
            uVar30 = uVar4;
            if (dVar49 < dVar52) {
              uVar30 = uVar15;
            }
            if (bVar45) {
              dVar52 = 0.0;
              dVar49 = 0.0;
              if (uVar4 != uVar3) {
                dVar49 = (double)(int)((uVar4 >> 0x10 & 0xff) - (uVar3 >> 0x10 & 0xff));
                dVar53 = (double)(int)((uVar4 & 0xff) - (uVar3 & 0xff));
                dVar54 = dVar53 * 0.0722 +
                         (double)(int)((uVar4 >> 8 & 0xff) - (uVar3 >> 8 & 0xff)) * 0.7152 +
                         dVar49 * 0.2126;
                dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
                dVar49 = (dVar49 - dVar54) * 0.63500127000254;
                dVar49 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar49 * dVar49 + dVar53 * dVar53)
                ;
              }
              if (uVar15 != uVar26) {
                dVar52 = (double)(int)((uVar15 >> 0x10 & 0xff) - (uVar26 >> 0x10 & 0xff));
                dVar53 = (double)(int)((uVar15 & 0xff) - (uVar26 & 0xff));
                dVar54 = dVar53 * 0.0722 +
                         (double)(int)((uVar15 >> 8 & 0xff) - (uVar26 >> 8 & 0xff)) * 0.7152 +
                         dVar52 * 0.2126;
                dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
                dVar52 = (dVar52 - dVar54) * 0.63500127000254;
                dVar52 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar52 * dVar52 + dVar53 * dVar53)
                ;
              }
              bVar45 = dVar49 < cfg->steepDirectionThreshold * dVar52;
              if (((dVar52 < cfg->steepDirectionThreshold * dVar49) || (uVar36 == uVar3)) ||
                 (uVar37 == uVar3)) {
                uVar3 = uVar30 >> 0x18;
                uVar41 = uVar30 & 0xff0000;
                uVar32 = uVar30 & 0xff00;
                uVar33 = uVar30 & 0xff;
                if ((uVar28 == uVar26 || uVar36 == uVar26) || bVar45) {
                  uVar30 = puVar21[uVar13];
                  uVar42 = ((uVar30 >> 0x18) * 7 + uVar3 & 0xfffffff8) << 0x15;
                  uVar38 = uVar42;
                  if (uVar30 >> 0x18 == 0xff) {
                    uVar38 = 0xff000000;
                  }
                  if (uVar3 != 0xff) {
                    uVar38 = uVar42;
                  }
                  puVar21[uVar13] =
                       ((uVar30 & 0xff0000) * 7 + uVar41 & 0x7f80000 |
                       (uVar30 & 0xff00) * 7 + uVar32 & 0x7f800 | (uVar30 & 0xff) * 7 + uVar33) >> 3
                       | uVar38;
                  uVar38 = *puVar21;
                  uVar42 = (uVar3 * 7 + (uVar38 >> 0x18) & 0xfffffff8) << 0x15;
                  uVar30 = uVar42;
                  if (uVar38 >> 0x18 == 0xff) {
                    uVar30 = 0xff000000;
                  }
                  if (uVar3 != 0xff) {
                    uVar30 = uVar42;
                  }
                  uVar42 = puVar21[1];
                  uVar19 = ((uVar42 >> 0x18) * 7 + uVar3 & 0xfffffff8) << 0x15;
                  uVar44 = uVar19;
                  if (uVar42 >> 0x18 == 0xff) {
                    uVar44 = 0xff000000;
                  }
                  if (uVar3 != 0xff) {
                    uVar44 = uVar19;
                  }
                  puVar21[1] = ((uVar42 & 0xff0000) * 7 + uVar41 & 0x7f80000 |
                               (uVar42 & 0xff00) * 7 + uVar32 & 0x7f800 |
                               (uVar42 & 0xff) * 7 + uVar33) >> 3 | uVar44;
                  uVar30 = ((uVar38 & 0xff0000) + uVar41 * 7 & 0x7f80000 |
                           (uVar38 & 0xff00) + uVar32 * 7 & 0x7f800 | (uVar38 & 0xff) + uVar33 * 7)
                           >> 3 | uVar30;
                }
                else {
                  uVar38 = puVar21[uVar13 * 2];
                  uVar44 = ((uVar38 >> 0x18) * 3 + uVar3 & 0xfffffffc) << 0x16;
                  uVar42 = uVar44;
                  if (uVar38 >> 0x18 == 0xff) {
                    uVar42 = 0xff000000;
                  }
                  if (uVar3 != 0xff) {
                    uVar42 = uVar44;
                  }
                  puVar21[uVar13 * 2] =
                       ((uVar38 & 0xff0000) * 3 + uVar41 & 0x3fc0000 |
                       (uVar38 & 0xff00) * 3 + uVar32 & 0x3fc00 | (uVar38 & 0xff) * 3 + uVar33) >> 2
                       | uVar42;
                  uVar38 = puVar21[1];
                  uVar44 = ((uVar38 >> 0x18) * 3 + uVar3 & 0xfffffffc) << 0x16;
                  uVar42 = uVar44;
                  if (uVar38 >> 0x18 == 0xff) {
                    uVar42 = 0xff000000;
                  }
                  if (uVar3 != 0xff) {
                    uVar42 = uVar44;
                  }
                  puVar21[1] = ((uVar38 & 0xff0000) * 3 + uVar41 & 0x3fc0000 |
                               (uVar38 & 0xff00) * 3 + uVar32 & 0x3fc00 |
                               (uVar38 & 0xff) * 3 + uVar33) >> 2 | uVar42;
                  uVar38 = puVar21[uVar13];
                  uVar44 = (uVar3 * 3 + (uVar38 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar42 = uVar44;
                  if (uVar38 >> 0x18 == 0xff) {
                    uVar42 = 0xff000000;
                  }
                  if (uVar3 != 0xff) {
                    uVar42 = uVar44;
                  }
                  puVar21[uVar13] =
                       ((uVar38 & 0xff0000) + uVar41 * 3 & 0x3fc0000 |
                       (uVar38 & 0xff00) + uVar32 * 3 & 0x3fc00 | (uVar38 & 0xff) + uVar33 * 3) >> 2
                       | uVar42;
                }
              }
              else {
                uVar33 = uVar30 >> 0x18;
                uVar3 = puVar21[2];
                uVar32 = ((uVar3 >> 0x18) * 3 + uVar33 & 0xfffffffc) << 0x16;
                if (uVar3 >> 0x18 == 0xff && uVar33 == 0xff) {
                  uVar32 = 0xff000000;
                }
                uVar41 = uVar30 & 0xff0000;
                uVar42 = uVar30 & 0xff00;
                uVar38 = uVar30 & 0xff;
                puVar21[2] = ((uVar3 & 0xff0000) * 3 + uVar41 & 0x3fc0000 |
                             (uVar3 & 0xff00) * 3 + uVar42 & 0x3fc00 | (uVar3 & 0xff) * 3 + uVar38)
                             >> 2 | uVar32;
                if ((uVar28 == uVar26 || uVar36 == uVar26) || bVar45) {
                  uVar3 = puVar21[uVar13];
                  uVar44 = ((uVar3 >> 0x18) * 3 + uVar33 & 0xfffffffc) << 0x16;
                  uVar32 = uVar44;
                  if (uVar3 >> 0x18 == 0xff) {
                    uVar32 = 0xff000000;
                  }
                  if (uVar33 != 0xff) {
                    uVar32 = uVar44;
                  }
                  puVar21[uVar13] =
                       ((uVar3 & 0xff0000) * 3 + uVar41 & 0x3fc0000 |
                       (uVar3 & 0xff00) * 3 + uVar42 & 0x3fc00 | (uVar3 & 0xff) * 3 + uVar38) >> 2 |
                       uVar32;
                  uVar3 = puVar21[1];
                  uVar44 = (uVar33 * 3 + (uVar3 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar32 = uVar44;
                  if (uVar3 >> 0x18 == 0xff) {
                    uVar32 = 0xff000000;
                  }
                  if (uVar33 != 0xff) {
                    uVar32 = uVar44;
                  }
                  puVar21[1] = ((uVar3 & 0xff0000) + uVar41 * 3 & 0x3fc0000 |
                               (uVar3 & 0xff00) + uVar42 * 3 & 0x3fc00 | (uVar3 & 0xff) + uVar38 * 3
                               ) >> 2 | uVar32;
                }
                else {
                  uVar3 = puVar21[uVar13 * 2];
                  uVar44 = ((uVar3 >> 0x18) * 3 + uVar33 & 0xfffffffc) << 0x16;
                  uVar32 = uVar44;
                  if (uVar3 >> 0x18 == 0xff) {
                    uVar32 = 0xff000000;
                  }
                  if (uVar33 != 0xff) {
                    uVar32 = uVar44;
                  }
                  puVar21[uVar13 * 2] =
                       ((uVar3 & 0xff0000) * 3 + uVar41 & 0x3fc0000 |
                       (uVar3 & 0xff00) * 3 + uVar42 & 0x3fc00 | (uVar3 & 0xff) * 3 + uVar38) >> 2 |
                       uVar32;
                  uVar3 = puVar21[1];
                  uVar44 = ((uVar3 >> 0x18) + uVar33 * 3 & 0xfffffffc) << 0x16;
                  uVar32 = uVar44;
                  if (uVar3 >> 0x18 == 0xff) {
                    uVar32 = 0xff000000;
                  }
                  if (uVar33 != 0xff) {
                    uVar32 = uVar44;
                  }
                  puVar21[1] = ((uVar3 & 0xff0000) + uVar41 * 3 & 0x3fc0000 |
                               (uVar3 & 0xff00) + uVar42 * 3 & 0x3fc00 | (uVar3 & 0xff) + uVar38 * 3
                               ) >> 2 | uVar32;
                  uVar3 = puVar21[uVar13];
                  uVar44 = (uVar33 * 3 + (uVar3 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar32 = uVar44;
                  if (uVar3 >> 0x18 == 0xff) {
                    uVar32 = 0xff000000;
                  }
                  if (uVar33 != 0xff) {
                    uVar32 = uVar44;
                  }
                  puVar21[uVar13] =
                       ((uVar3 & 0xff0000) + uVar41 * 3 & 0x3fc0000 |
                       (uVar3 & 0xff00) + uVar42 * 3 & 0x3fc00 | (uVar3 & 0xff) + uVar38 * 3) >> 2 |
                       uVar32;
                }
              }
            }
            else {
              uVar3 = *puVar21;
              if ((uVar30 >> 0x18 != 0xff) || (uVar33 = 0xff000000, uVar3 >> 0x18 != 0xff)) {
                uVar33 = ((uVar3 >> 0x18) * 0x37 + (uVar30 >> 0x18) * 0x2d) * 0x28f60 & 0xff000000;
              }
              uVar30 = ((uVar3 & 0xff) * 0x37 + (uVar30 & 0xff) * 0x2d) / 100 | uVar33 |
                       ((uVar3 & 0xff00) * 0x37 + (uVar30 & 0xff00) * 0x2d) / 100 & 0xff00 |
                       ((uVar3 & 0xff0000) * 0x37 + (uVar30 & 0xff0000) * 0x2d) / 100 & 0xff0000;
            }
            *puVar21 = uVar30;
          }
          if ((bVar2 & 0xc0) != 0) {
            bVar45 = true;
            if ((bVar2 & 0x80) == 0) {
              if (cVar22 == '\0' && (bVar2 & 0x30) == 0) {
LAB_00444d9b:
                if (0x3f < (byte)(bVar2 << 6 | bVar23 >> 2)) {
                  dVar51 = 0.0;
                  if (uVar36 != uVar5) {
                    dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                    dVar51 = (double)(int)((uVar36 & 0xff) - (uVar5 & 0xff));
                    dVar49 = dVar51 * 0.0722 +
                             (double)(int)((uVar36 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                             dVar52 * 0.2126;
                    dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                    dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                    dVar49 = dVar49 * cfg->luminanceWeight_;
                    dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                  }
                  if (cfg->equalColorTolerance_ <= dVar51) goto LAB_00445230;
                }
                dVar51 = 0.0;
                if (uVar14 != uVar4) {
                  dVar52 = (double)(int)((uVar14 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
                  dVar51 = (double)(int)((uVar14 & 0xff) - (uVar4 & 0xff));
                  dVar49 = dVar51 * 0.0722 +
                           (double)(int)((uVar14 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                  dVar49 = dVar49 * cfg->luminanceWeight_;
                  dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                }
                dVar49 = cfg->equalColorTolerance_;
                if (dVar51 < dVar49) {
                  dVar51 = 0.0;
                  if (uVar4 != uVar26) {
                    dVar53 = (double)(int)((uVar4 >> 0x10 & 0xff) - (uVar26 >> 0x10 & 0xff));
                    dVar51 = (double)(int)((uVar4 & 0xff) - (uVar26 & 0xff));
                    dVar52 = dVar51 * 0.0722 +
                             (double)(int)((uVar4 >> 8 & 0xff) - (uVar26 >> 8 & 0xff)) * 0.7152 +
                             dVar53 * 0.2126;
                    dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                    dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                    dVar52 = dVar52 * cfg->luminanceWeight_;
                    dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                  }
                  if (dVar51 < dVar49) {
                    dVar51 = 0.0;
                    if (uVar26 != uVar28) {
                      dVar53 = (double)(int)((uVar26 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
                      dVar51 = (double)(int)((uVar26 & 0xff) - (uVar28 & 0xff));
                      dVar52 = dVar51 * 0.0722 +
                               (double)(int)((uVar26 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) * 0.7152 +
                               dVar53 * 0.2126;
                      dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                      dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                      dVar52 = dVar52 * cfg->luminanceWeight_;
                      dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                    }
                    if (dVar51 < dVar49) {
                      dVar51 = 0.0;
                      if (uVar28 != uVar5) {
                        dVar53 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                        dVar51 = (double)(int)((uVar28 & 0xff) - (uVar5 & 0xff));
                        dVar52 = dVar51 * 0.0722 +
                                 (double)(int)((uVar28 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152
                                 + dVar53 * 0.2126;
                        dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                        dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                        dVar52 = dVar52 * cfg->luminanceWeight_;
                        dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                      }
                      if (dVar51 < dVar49) {
                        dVar51 = 0.0;
                        if (uVar36 != uVar26) {
                          dVar53 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar26 >> 0x10 & 0xff));
                          dVar51 = (double)(int)((uVar36 & 0xff) - (uVar26 & 0xff));
                          dVar52 = dVar51 * 0.0722 +
                                   (double)(int)((uVar36 >> 8 & 0xff) - (uVar26 >> 8 & 0xff)) *
                                   0.7152 + dVar53 * 0.2126;
                          dVar51 = (dVar51 - dVar52) * 0.5389092476826902;
                          dVar53 = (dVar53 - dVar52) * 0.63500127000254;
                          dVar52 = dVar52 * cfg->luminanceWeight_;
                          dVar51 = SQRT(dVar52 * dVar52 + dVar53 * dVar53 + dVar51 * dVar51);
                        }
                        if (dVar49 <= dVar51) goto LAB_00445230;
                      }
                    }
                  }
                }
              }
              else {
                dVar51 = 0.0;
                if (uVar36 != uVar14) {
                  dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar14 >> 0x10 & 0xff));
                  dVar51 = (double)(int)((uVar36 & 0xff) - (uVar14 & 0xff));
                  dVar49 = dVar51 * 0.0722 +
                           (double)(int)((uVar36 >> 8 & 0xff) - (uVar14 >> 8 & 0xff)) * 0.7152 +
                           dVar52 * 0.2126;
                  dVar51 = (dVar51 - dVar49) * 0.5389092476826902;
                  dVar52 = (dVar52 - dVar49) * 0.63500127000254;
                  dVar49 = dVar49 * cfg->luminanceWeight_;
                  dVar51 = SQRT(dVar49 * dVar49 + dVar52 * dVar52 + dVar51 * dVar51);
                }
                if (dVar51 < cfg->equalColorTolerance_) goto LAB_00444d9b;
LAB_00445230:
                bVar45 = false;
              }
            }
            dVar51 = cfg->luminanceWeight_;
            dVar49 = 0.0;
            dVar52 = 0.0;
            if (uVar36 != uVar28) {
              dVar52 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar28 >> 0x10 & 0xff));
              dVar53 = (double)(int)((uVar36 & 0xff) - (uVar28 & 0xff));
              dVar54 = dVar53 * 0.0722 +
                       (double)(int)((uVar36 >> 8 & 0xff) - (uVar28 >> 8 & 0xff)) * 0.7152 +
                       dVar52 * 0.2126;
              dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
              dVar52 = (dVar52 - dVar54) * 0.63500127000254;
              dVar52 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar52 * dVar52 + dVar53 * dVar53);
            }
            if (uVar36 != uVar4) {
              dVar49 = (double)(int)((uVar36 >> 0x10 & 0xff) - (uVar4 >> 0x10 & 0xff));
              dVar53 = (double)(int)((uVar36 & 0xff) - (uVar4 & 0xff));
              dVar54 = dVar53 * 0.0722 +
                       (double)(int)((uVar36 >> 8 & 0xff) - (uVar4 >> 8 & 0xff)) * 0.7152 +
                       dVar49 * 0.2126;
              dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
              dVar49 = (dVar49 - dVar54) * 0.63500127000254;
              dVar49 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar49 * dVar49 + dVar53 * dVar53);
            }
            uVar3 = uVar28;
            if (dVar49 < dVar52) {
              uVar3 = uVar4;
            }
            if (bVar45) {
              dVar52 = 0.0;
              dVar49 = 0.0;
              if (uVar28 != uVar14) {
                dVar49 = (double)(int)((uVar28 >> 0x10 & 0xff) - (uVar14 >> 0x10 & 0xff));
                dVar53 = (double)(int)((uVar28 & 0xff) - (uVar14 & 0xff));
                dVar54 = dVar53 * 0.0722 +
                         (double)(int)((uVar28 >> 8 & 0xff) - (uVar14 >> 8 & 0xff)) * 0.7152 +
                         dVar49 * 0.2126;
                dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
                dVar49 = (dVar49 - dVar54) * 0.63500127000254;
                dVar49 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar49 * dVar49 + dVar53 * dVar53)
                ;
              }
              if (uVar4 != uVar5) {
                dVar52 = (double)(int)((uVar4 >> 0x10 & 0xff) - (uVar5 >> 0x10 & 0xff));
                dVar53 = (double)(int)((uVar4 & 0xff) - (uVar5 & 0xff));
                dVar54 = dVar53 * 0.0722 +
                         (double)(int)((uVar4 >> 8 & 0xff) - (uVar5 >> 8 & 0xff)) * 0.7152 +
                         dVar52 * 0.2126;
                dVar53 = (dVar53 - dVar54) * 0.5389092476826902;
                dVar52 = (dVar52 - dVar54) * 0.63500127000254;
                dVar52 = SQRT(dVar54 * dVar51 * dVar54 * dVar51 + dVar52 * dVar52 + dVar53 * dVar53)
                ;
              }
              bVar45 = dVar49 < cfg->steepDirectionThreshold * dVar52;
              uVar4 = uVar3 >> 0x18;
              if (((dVar52 < cfg->steepDirectionThreshold * dVar49) || (uVar36 == uVar14)) ||
                 (uVar15 == uVar14)) {
                uVar26 = uVar3 & 0xff0000;
                uVar15 = uVar3 & 0xff00;
                uVar14 = uVar3 & 0xff;
                if ((uVar37 == uVar5 || uVar36 == uVar5) || bVar45) {
                  uVar36 = puVar21[uVar13 * 2 + 1];
                  uVar28 = ((uVar36 >> 0x18) * 7 + uVar4 & 0xfffffff8) << 0x15;
                  uVar37 = uVar28;
                  if (uVar36 >> 0x18 == 0xff) {
                    uVar37 = 0xff000000;
                  }
                  if (uVar4 != 0xff) {
                    uVar37 = uVar28;
                  }
                  puVar21[uVar13 * 2 + 1] =
                       ((uVar36 & 0xff0000) * 7 + uVar26 & 0x7f80000 |
                       (uVar36 & 0xff00) * 7 + uVar15 & 0x7f800 | (uVar36 & 0xff) * 7 + uVar14) >> 3
                       | uVar37;
                  uVar36 = puVar21[uVar13];
                  uVar28 = ((uVar36 >> 0x18) * 7 + uVar4 & 0xfffffff8) << 0x15;
                  uVar37 = uVar28;
                  if (uVar36 >> 0x18 == 0xff) {
                    uVar37 = 0xff000000;
                  }
                  if (uVar4 != 0xff) {
                    uVar37 = uVar28;
                  }
                  puVar21[uVar13] =
                       ((uVar36 & 0xff0000) * 7 + uVar26 & 0x7f80000 |
                       (uVar36 & 0xff00) * 7 + uVar15 & 0x7f800 | (uVar36 & 0xff) * 7 + uVar14) >> 3
                       | uVar37;
                  uVar36 = puVar21[uVar13 * 2];
                  uVar28 = (uVar4 * 7 + (uVar36 >> 0x18) & 0xfffffff8) << 0x15;
                  uVar37 = uVar28;
                  if (uVar36 >> 0x18 == 0xff) {
                    uVar37 = 0xff000000;
                  }
                  if (uVar4 != 0xff) {
                    uVar37 = uVar28;
                  }
                  puVar21[uVar13 * 2] =
                       ((uVar36 & 0xff0000) + uVar26 * 7 & 0x7f80000 |
                       (uVar36 & 0xff00) + uVar15 * 7 & 0x7f800 |
                       (uVar36 & 0xff) + ((uVar3 & 0xff) * 8 - uVar14)) >> 3 | uVar37;
                }
                else {
                  uVar36 = puVar21[uVar13 * 2 + 2];
                  uVar28 = ((uVar36 >> 0x18) * 3 + uVar4 & 0xfffffffc) << 0x16;
                  uVar37 = uVar28;
                  if (uVar36 >> 0x18 == 0xff) {
                    uVar37 = 0xff000000;
                  }
                  if (uVar4 != 0xff) {
                    uVar37 = uVar28;
                  }
                  puVar21[uVar13 * 2 + 2] =
                       ((uVar36 & 0xff0000) * 3 + uVar26 & 0x3fc0000 |
                       (uVar36 & 0xff00) * 3 + uVar15 & 0x3fc00 | (uVar36 & 0xff) * 3 + uVar14) >> 2
                       | uVar37;
                  uVar36 = puVar21[uVar13];
                  uVar28 = ((uVar36 >> 0x18) * 3 + uVar4 & 0xfffffffc) << 0x16;
                  uVar37 = uVar28;
                  if (uVar36 >> 0x18 == 0xff) {
                    uVar37 = 0xff000000;
                  }
                  if (uVar4 != 0xff) {
                    uVar37 = uVar28;
                  }
                  puVar21[uVar13] =
                       ((uVar36 & 0xff0000) * 3 + uVar26 & 0x3fc0000 |
                       (uVar36 & 0xff00) * 3 + uVar15 & 0x3fc00 | (uVar36 & 0xff) * 3 + uVar14) >> 2
                       | uVar37;
                  uVar14 = puVar21[uVar13 * 2 + 1];
                  uVar37 = (uVar4 * 3 + (uVar14 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar36 = uVar37;
                  if (uVar14 >> 0x18 == 0xff) {
                    uVar36 = 0xff000000;
                  }
                  if (uVar4 != 0xff) {
                    uVar36 = uVar37;
                  }
                  puVar21[uVar13 * 2 + 1] =
                       ((uVar14 & 0xff0000) + uVar26 * 3 & 0x3fc0000 |
                       (uVar14 & 0xff00) + uVar15 * 3 & 0x3fc00 |
                       (uVar14 & 0xff) + (uVar3 & 0xff) + (uVar3 & 0xff) * 2) >> 2 | uVar36;
                  puVar21[uVar13 * 2] = uVar3;
                }
              }
              else {
                uVar14 = *puVar21;
                uVar15 = ((uVar14 >> 0x18) * 3 + uVar4 & 0xfffffffc) << 0x16;
                if (uVar14 >> 0x18 == 0xff && uVar4 == 0xff) {
                  uVar15 = 0xff000000;
                }
                uVar26 = uVar3 & 0xff0000;
                uVar30 = uVar3 & 0xff00;
                uVar28 = uVar3 & 0xff;
                *puVar21 = ((uVar14 & 0xff0000) * 3 + uVar26 & 0x3fc0000 |
                           (uVar14 & 0xff00) * 3 + uVar30 & 0x3fc00 | (uVar14 & 0xff) * 3 + uVar28)
                           >> 2 | uVar15;
                if ((uVar37 == uVar5 || uVar36 == uVar5) || bVar45) {
                  uVar14 = puVar21[uVar13 * 2 + 1];
                  uVar36 = ((uVar14 >> 0x18) * 3 + uVar4 & 0xfffffffc) << 0x16;
                  uVar15 = uVar36;
                  if (uVar14 >> 0x18 == 0xff) {
                    uVar15 = 0xff000000;
                  }
                  if (uVar4 != 0xff) {
                    uVar15 = uVar36;
                  }
                  puVar21[uVar13 * 2 + 1] =
                       ((uVar14 & 0xff0000) * 3 + uVar26 & 0x3fc0000 |
                       (uVar14 & 0xff00) * 3 + uVar30 & 0x3fc00 | (uVar14 & 0xff) * 3 + uVar28) >> 2
                       | uVar15;
                  uVar14 = puVar21[uVar13];
                  uVar36 = (uVar4 * 3 + (uVar14 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar15 = uVar36;
                  if (uVar14 >> 0x18 == 0xff) {
                    uVar15 = 0xff000000;
                  }
                  if (uVar4 != 0xff) {
                    uVar15 = uVar36;
                  }
                  puVar21[uVar13] =
                       ((uVar14 & 0xff0000) + uVar26 * 3 & 0x3fc0000 |
                       (uVar14 & 0xff00) + uVar30 * 3 & 0x3fc00 | (uVar14 & 0xff) + uVar28 * 3) >> 2
                       | uVar15;
                  puVar21[uVar13 * 2] = uVar3;
                }
                else {
                  uVar14 = puVar21[uVar13 * 2 + 2];
                  uVar36 = ((uVar14 >> 0x18) * 3 + uVar4 & 0xfffffffc) << 0x16;
                  uVar15 = uVar36;
                  if (uVar14 >> 0x18 == 0xff) {
                    uVar15 = 0xff000000;
                  }
                  if (uVar4 != 0xff) {
                    uVar15 = uVar36;
                  }
                  puVar21[uVar13 * 2 + 2] =
                       ((uVar14 & 0xff0000) * 3 + uVar26 & 0x3fc0000 |
                       (uVar14 & 0xff00) * 3 + uVar30 & 0x3fc00 | (uVar14 & 0xff) * 3 + uVar28) >> 2
                       | uVar15;
                  uVar14 = puVar21[uVar13];
                  uVar36 = ((uVar14 >> 0x18) + uVar4 * 3 & 0xfffffffc) << 0x16;
                  uVar15 = uVar36;
                  if (uVar14 >> 0x18 == 0xff) {
                    uVar15 = 0xff000000;
                  }
                  if (uVar4 != 0xff) {
                    uVar15 = uVar36;
                  }
                  puVar21[uVar13] =
                       ((uVar14 & 0xff0000) + uVar26 * 3 & 0x3fc0000 |
                       (uVar14 & 0xff00) + uVar30 * 3 & 0x3fc00 | (uVar14 & 0xff) + uVar28 * 3) >> 2
                       | uVar15;
                  uVar14 = puVar21[uVar13 * 2 + 1];
                  uVar36 = (uVar4 * 3 + (uVar14 >> 0x18) & 0xfffffffc) << 0x16;
                  uVar15 = uVar36;
                  if (uVar14 >> 0x18 == 0xff) {
                    uVar15 = 0xff000000;
                  }
                  if (uVar4 != 0xff) {
                    uVar15 = uVar36;
                  }
                  puVar21[uVar13 * 2 + 1] =
                       ((uVar14 & 0xff0000) + uVar26 * 3 & 0x3fc0000 |
                       (uVar14 & 0xff00) + uVar30 * 3 & 0x3fc00 | (uVar14 & 0xff) + uVar28 * 3) >> 2
                       | uVar15;
                  puVar21[uVar13 * 2] = uVar3;
                }
              }
            }
            else {
              uVar14 = puVar21[uVar13 * 2];
              if ((uVar3 >> 0x18 != 0xff) || (uVar15 = 0xff000000, uVar14 >> 0x18 != 0xff)) {
                uVar15 = ((uVar14 >> 0x18) * 0x37 + (uVar3 >> 0x18) * 0x2d) * 0x28f60 & 0xff000000;
              }
              puVar21[uVar13 * 2] =
                   ((uVar14 & 0xff) * 0x37 + (uVar3 & 0xff) * 0x2d) / 100 | uVar15 |
                   ((uVar14 & 0xff00) * 0x37 + (uVar3 & 0xff00) * 0x2d) / 100 & 0xff00 |
                   ((uVar14 & 0xff0000) * 0x37 + (uVar3 & 0xff0000) * 0x2d) / 100 & 0xff0000;
            }
          }
        }
        puVar21 = puVar21 + 3;
        local_90 = local_90 + 3;
        uVar39 = uVar40;
      } while (uVar40 != __n);
      uVar9 = uVar9 + srcWidth * 9;
    } while (uVar31 != (uint)yLast);
  }
  return;
}

Assistant:

void scaleImage(const uint32_t* src, uint32_t* trg, int srcWidth, int srcHeight, const xbrz_old::ScalerCfg& cfg, int yFirst, int yLast)
{
    yFirst = std::max(yFirst, 0);
    yLast  = std::min(yLast, srcHeight);
    if (yFirst >= yLast || srcWidth <= 0)
        return;

    const int trgWidth = srcWidth * Scaler::scale;

    //"use" space at the end of the image as temporary buffer for "on the fly preprocessing": we even could use larger area of
    //"sizeof(uint32_t) * srcWidth * (yLast - yFirst)" bytes without risk of accidental overwriting before accessing
    const int bufferSize = srcWidth;
    unsigned char* preProcBuffer = reinterpret_cast<unsigned char*>(trg + yLast * Scaler::scale * trgWidth) - bufferSize;
    std::fill(preProcBuffer, preProcBuffer + bufferSize, 0);
#ifdef XBRZ_CXX11
    static_assert(BLEND_NONE == 0, "");
#endif // XBRZ_CXX11

    //initialize preprocessing buffer for first row: detect upper left and right corner blending
    //this cannot be optimized for adjacent processing stripes; we must not allow for a memory race condition!
    if (yFirst > 0)
    {
        const int y = yFirst - 1;

        const uint32_t* s_m1 = src + srcWidth * std::max(y - 1, 0);
        const uint32_t* s_0  = src + srcWidth * y; //center line
        const uint32_t* s_p1 = src + srcWidth * std::min(y + 1, srcHeight - 1);
        const uint32_t* s_p2 = src + srcWidth * std::min(y + 2, srcHeight - 1);

        for (int x = 0; x < srcWidth; ++x)
        {
            const int x_m1 = std::max(x - 1, 0);
            const int x_p1 = std::min(x + 1, srcWidth - 1);
            const int x_p2 = std::min(x + 2, srcWidth - 1);

            Kernel_4x4 ker = {}; //perf: initialization is negligable
            ker.a = s_m1[x_m1]; //read sequentially from memory as far as possible
            ker.b = s_m1[x];
            ker.c = s_m1[x_p1];
            ker.d = s_m1[x_p2];

            ker.e = s_0[x_m1];
            ker.f = s_0[x];
            ker.g = s_0[x_p1];
            ker.h = s_0[x_p2];

            ker.i = s_p1[x_m1];
            ker.j = s_p1[x];
            ker.k = s_p1[x_p1];
            ker.l = s_p1[x_p2];

            ker.m = s_p2[x_m1];
            ker.n = s_p2[x];
            ker.o = s_p2[x_p1];
            ker.p = s_p2[x_p2];

            const BlendResult res = preProcessCorners(ker, cfg);
            /*
            preprocessing blend result:
            ---------
            | F | G |   //evalute corner between F, G, J, K
            ----|---|   //input pixel is at position F
            | J | K |
            ---------
            */
            setTopR(preProcBuffer[x], res.blend_j);

            if (x + 1 < srcWidth)
                setTopL(preProcBuffer[x + 1], res.blend_k);
        }
    }
    //------------------------------------------------------------------------------------

    for (int y = yFirst; y < yLast; ++y)
    {
        uint32_t* out = trg + Scaler::scale * y * trgWidth; //consider MT "striped" access

        const uint32_t* s_m1 = src + srcWidth * std::max(y - 1, 0);
        const uint32_t* s_0  = src + srcWidth * y; //center line
        const uint32_t* s_p1 = src + srcWidth * std::min(y + 1, srcHeight - 1);
        const uint32_t* s_p2 = src + srcWidth * std::min(y + 2, srcHeight - 1);

        unsigned char blend_xy1 = 0; //corner blending for current (x, y + 1) position

        for (int x = 0; x < srcWidth; ++x, out += Scaler::scale)
        {
#ifndef NDEBUG
            breakIntoDebugger = debugPixelX == x && debugPixelY == y;
#endif
            //all those bounds checks have only insignificant impact on performance!
            const int x_m1 = std::max(x - 1, 0); //perf: prefer array indexing to additional pointers!
            const int x_p1 = std::min(x + 1, srcWidth - 1);
            const int x_p2 = std::min(x + 2, srcWidth - 1);

            //evaluate the four corners on bottom-right of current pixel
            unsigned char blend_xy = 0; //for current (x, y) position
            {
                Kernel_4x4 ker = {}; //perf: initialization is negligable
                ker.a = s_m1[x_m1]; //read sequentially from memory as far as possible
                ker.b = s_m1[x];
                ker.c = s_m1[x_p1];
                ker.d = s_m1[x_p2];

                ker.e = s_0[x_m1];
                ker.f = s_0[x];
                ker.g = s_0[x_p1];
                ker.h = s_0[x_p2];

                ker.i = s_p1[x_m1];
                ker.j = s_p1[x];
                ker.k = s_p1[x_p1];
                ker.l = s_p1[x_p2];

                ker.m = s_p2[x_m1];
                ker.n = s_p2[x];
                ker.o = s_p2[x_p1];
                ker.p = s_p2[x_p2];

                const BlendResult res = preProcessCorners(ker, cfg);
                /*
                preprocessing blend result:
                ---------
                | F | G |   //evalute corner between F, G, J, K
                ----|---|   //current input pixel is at position F
                | J | K |
                ---------
                */
                blend_xy = preProcBuffer[x];
                setBottomR(blend_xy, res.blend_f); //all four corners of (x, y) have been determined at this point due to processing sequence!

                setTopR(blend_xy1, res.blend_j); //set 2nd known corner for (x, y + 1)
                preProcBuffer[x] = blend_xy1; //store on current buffer position for use on next row

                blend_xy1 = 0;
                setTopL(blend_xy1, res.blend_k); //set 1st known corner for (x + 1, y + 1) and buffer for use on next column

                if (x + 1 < srcWidth) //set 3rd known corner for (x + 1, y)
                    setBottomL(preProcBuffer[x + 1], res.blend_g);
            }

            //fill block of size scale * scale with the given color
            fillBlock(out, trgWidth * sizeof(uint32_t), s_0[x], Scaler::scale); //place *after* preprocessing step, to not overwrite the results while processing the the last pixel!

            //blend four corners of current pixel
            if (blendingNeeded(blend_xy)) //good 20% perf-improvement
            {
                Kernel_3x3 ker = {}; //perf: initialization is negligable

                ker.a = s_m1[x_m1]; //read sequentially from memory as far as possible
                ker.b = s_m1[x];
                ker.c = s_m1[x_p1];

                ker.d = s_0[x_m1];
                ker.e = s_0[x];
                ker.f = s_0[x_p1];

                ker.g = s_p1[x_m1];
                ker.h = s_p1[x];
                ker.i = s_p1[x_p1];

                scalePixel<Scaler, ROT_0  >(ker, out, trgWidth, blend_xy, cfg);
                scalePixel<Scaler, ROT_90 >(ker, out, trgWidth, blend_xy, cfg);
                scalePixel<Scaler, ROT_180>(ker, out, trgWidth, blend_xy, cfg);
                scalePixel<Scaler, ROT_270>(ker, out, trgWidth, blend_xy, cfg);
            }
        }
    }
}